

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

bool P_NoWayTraverse(AActor *usething,DVector2 *start,DVector2 *end)

{
  double dVar1;
  line_t_conflict *linedef;
  intercept_t *piVar2;
  bool bVar3;
  FPathTraverse it;
  FLineOpening open;
  DVector2 local_118;
  FPathTraverse local_100;
  FLineOpening local_c0;
  
  local_100._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_006fa0a8;
  FPathTraverse::init(&local_100,(EVP_PKEY_CTX *)0x1);
  while (piVar2 = FPathTraverse::Next(&local_100), piVar2 != (intercept_t *)0x0) {
    linedef = (piVar2->d).line;
    if (linedef->special == 0) {
      if ((linedef->portalindex < linePortals.Count) &&
         ((linePortals.Array[linedef->portalindex].mFlags & 2) != 0)) break;
      bVar3 = true;
      if ((linedef->flags & 0xc001) != 0) goto LAB_00413793;
      local_118.X = piVar2->frac * local_100.trace.dx + local_100.trace.x;
      local_118.Y = piVar2->frac * local_100.trace.dy + local_100.trace.y;
      P_LineOpening(&local_c0,(AActor *)0x0,(line_t *)linedef,&local_118,(DVector2 *)0x0,0);
      if (((local_c0.range <= 0.0) ||
          (dVar1 = (usething->__Pos).Z, usething->MaxStepHeight + dVar1 < local_c0.bottom)) ||
         (local_c0.top < dVar1 + usething->Height)) goto LAB_00413793;
    }
  }
  bVar3 = false;
LAB_00413793:
  FPathTraverse::~FPathTraverse(&local_100);
  return bVar3;
}

Assistant:

bool P_NoWayTraverse(AActor *usething, const DVector2 &start, const DVector2 &end)
{
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES);
	intercept_t *in;

	while ((in = it.Next()))
	{
		line_t *ld = in->d.line;
		FLineOpening open;

		// [GrafZahl] de-obfuscated. Was I the only one who was unable to make sense out of
		// this convoluted mess?
		if (ld->special) continue;
		if (ld->isLinePortal()) return false;
		if (ld->flags&(ML_BLOCKING | ML_BLOCKEVERYTHING | ML_BLOCK_PLAYERS)) return true;
		P_LineOpening(open, NULL, ld, it.InterceptPoint(in));
		if (open.range <= 0 ||
			open.bottom > usething->Z() + usething->MaxStepHeight ||
			open.top < usething->Top()) return true;
	}
	return false;
}